

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O3

pair<std::shared_ptr<cornelich::region>,_long> * __thiscall
cornelich::vanilla_index::append
          (pair<std::shared_ptr<cornelich::region>,_long> *__return_storage_ptr__,
          vanilla_index *this,int32_t cycle,int64_t index_value,int32_t file_number)

{
  bool bVar1;
  undefined8 uVar2;
  int64_t iVar3;
  logic_error *this_00;
  region_ptr region;
  string local_1f8;
  string local_1d8 [32];
  undefined1 local_1b8 [16];
  ostream local_1a8 [376];
  
  if (file_number < 10000) {
    do {
      index_for((vanilla_index *)local_1b8,(int32_t)this,cycle,SUB41(file_number,0));
      uVar2 = local_1b8._0_8_;
      if ((vanilla_chronicle_settings *)local_1b8._0_8_ == (vanilla_chronicle_settings *)0x0) {
        bVar1 = false;
      }
      else {
        iVar3 = append((region *)local_1b8._0_8_,index_value);
        if (iVar3 < 0) {
          bVar1 = false;
        }
        else {
          (__return_storage_ptr__->first).
          super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar2;
          (__return_storage_ptr__->first).
          super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_1b8._8_8_ + 8) = *(_Atomic_word *)(local_1b8._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_1b8._8_8_ + 8) = *(_Atomic_word *)(local_1b8._8_8_ + 8) + 1;
            }
          }
          __return_storage_ptr__->second = iVar3;
          bVar1 = true;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
      }
      if (bVar1) {
        return __return_storage_ptr__;
      }
      file_number = file_number + 1;
    } while (file_number != 10000);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unable to write index",0x15);
  std::ostream::_M_insert<long>((long)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"on cycle ",9);
  std::ostream::operator<<(local_1a8,cycle);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(",1);
  cycle_formatter::date_from_cycle_abi_cxx11_
            (&local_1f8,
             (this->m_settings->m_cycle_format).
             super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (long)cycle);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")",1);
  std::__cxx11::stringbuf::str();
  std::logic_error::logic_error(this_00,local_1d8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::pair<region_ptr, std::int64_t> vanilla_index::append(std::int32_t cycle, std::int64_t index_value, std::int32_t file_number)
{
    for (int index_count = file_number; index_count < 10000; ++index_count)
    {
        auto region = index_for(cycle, index_count, true);
        if(!region)
            continue;
        auto position = append(*region, index_value);
        if (position >= 0) {
            return {region, position};
        }
    }

    throw std::logic_error((util::streamer()
                            << "Unable to write index" << index_value
                            << "on cycle " << cycle
                            << "(" <<  m_settings.cycle_format().date_from_cycle(cycle) << ")").str());
}